

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unswitch_pass.cpp
# Opt level: O3

iterator __thiscall
spvtools::opt::anon_unknown_0::LoopUnswitch::FindBasicBlockPosition
          (LoopUnswitch *this,BasicBlock *bb_to_find)

{
  Function *pFVar1;
  uint32_t uVar2;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> UVar3;
  iterator iVar4;
  
  pFVar1 = this->function_;
  uVar2 = 0;
  if (*(char *)((long)&(bb_to_find->insts_).super_IntrusiveList<spvtools::opt::Instruction>.
                       sentinel_.super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_
               + 5) == '\x01') {
    uVar2 = Instruction::GetSingleWordOperand
                      ((Instruction *)bb_to_find,
                       (uint)*(byte *)((long)&(bb_to_find->insts_).
                                              super_IntrusiveList<spvtools::opt::Instruction>.
                                              sentinel_.
                                              super_IntrusiveNodeBase<spvtools::opt::Instruction>.
                                              previous_node_ + 4));
  }
  UVar3 = std::
          __find_if<spvtools::opt::UptrVectorIterator<spvtools::opt::BasicBlock,false>,__gnu_cxx::__ops::_Iter_pred<spvtools::opt::Function::FindBlock(unsigned_int)::_lambda(spvtools::opt::BasicBlock_const&)_1_>>
                    (&pFVar1->blocks_,
                     (pFVar1->blocks_).
                     super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,&pFVar1->blocks_,
                     (pFVar1->blocks_).
                     super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,uVar2);
  if ((UVar3.container_ == &this->function_->blocks_) &&
     (UVar3.iterator_._M_current._M_current ==
      (this->function_->blocks_).
      super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    __assert_fail("it != function_->end() && \"Basic Block not found\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_unswitch_pass.cpp"
                  ,0x57,
                  "Function::iterator spvtools::opt::(anonymous namespace)::LoopUnswitch::FindBasicBlockPosition(BasicBlock *)"
                 );
  }
  iVar4.container_ = UVar3.container_;
  iVar4.iterator_._M_current = UVar3.iterator_._M_current;
  return iVar4;
}

Assistant:

Function::iterator FindBasicBlockPosition(BasicBlock* bb_to_find) {
    Function::iterator it = function_->FindBlock(bb_to_find->id());
    assert(it != function_->end() && "Basic Block not found");
    return it;
  }